

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example2.cpp
# Opt level: O1

void pop_up_built_in_dialog_proc(Am_Object param_1)

{
  Am_Value_List *pAVar1;
  Am_Value value;
  Am_String local_40 [8];
  Am_Value_List local_38 [16];
  Am_Value local_28;
  Am_Value_List local_18 [16];
  
  Am_Value_List::Am_Value_List(local_18);
  pAVar1 = (Am_Value_List *)Am_Value_List::Add(local_18,"Type a string to return:",1,1);
  Am_Value_List::Am_Value_List(local_38,pAVar1);
  Am_String::Am_String(local_40,"",true);
  Am_Get_Input_From_Dialog(&local_28,local_38,local_40,0xffffd8f0,0xffffd8f0,1);
  Am_String::~Am_String(local_40);
  Am_Value_List::~Am_Value_List(local_38);
  Am_Value_List::~Am_Value_List(local_18);
  Set_Value_Into_String(&local_28);
  Am_Value::~Am_Value(&local_28);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, pop_up_built_in_dialog,
		 (Am_Object /* cmd */)) {
  Am_Value value =
    Am_Get_Input_From_Dialog (Am_Value_List().Add("Type a string to return:"));
  //now convert the value into a string for the pop_up_value_string
  Set_Value_Into_String(value);
}